

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::a64::EmitHelper::emitArgMove
          (EmitHelper *this,BaseReg *dst_,TypeId dstTypeId,Operand_ *src_,TypeId srcTypeId,
          char *comment)

{
  byte bVar1;
  char cVar2;
  uint16_t uVar3;
  uint uVar4;
  BaseEmitter *pBVar5;
  byte bVar6;
  undefined4 uVar7;
  uint uVar8;
  Error EVar9;
  Error EVar10;
  GroupData *pGVar11;
  Reg *pRVar12;
  LoadStoreInstructions *pLVar13;
  ulong uVar14;
  uint32_t uVar15;
  ulong uVar16;
  undefined7 in_register_00000011;
  InstId IVar17;
  bool bVar18;
  Reg dst;
  Operand src;
  RegGroup RStack_159;
  BaseEmitter *pBStack_158;
  Operand_ OStack_150;
  uint32_t uStack_140;
  uint32_t uStack_13c;
  EVP_PKEY_CTX *pEStack_138;
  Operand_ OStack_130;
  Operand_ OStack_120;
  ulong uStack_110;
  PrologEpilogInfo PStack_104;
  char *pcStack_78;
  ulong uStack_70;
  Operand_ local_48;
  Operand_ local_38;
  
  uVar16 = CONCAT71(in_register_00000011,dstTypeId) & 0xffffffff;
  if ((int)CONCAT71(in_register_00000011,dstTypeId) == 0) {
    uVar16 = CONCAT71((int7)(uVar16 >> 8),
                      *(undefined1 *)
                       ((ulong)((dst_->super_Operand).super_Operand_._signature._bits >> 3 & 0x1f) +
                       (ulong)(((this->super_BaseEmitHelper)._emitter)->_environment)._arch * 0xd8 +
                       0x14e094));
  }
  bVar6 = (byte)uVar16;
  if (((byte)(bVar6 + 0x9b) < 0xbb) || ((bVar6 & 0x7e) == 0x20)) {
    emitArgMove();
LAB_0013751c:
    emitArgMove();
    pBVar5 = (this->super_BaseEmitHelper)._emitter;
    pcStack_78 = comment;
    uStack_70 = uVar16;
    EVar9 = PrologEpilogInfo::init(&PStack_104,(EVP_PKEY_CTX *)dst_);
    if (EVar9 != 0) {
      return EVar9;
    }
    uStack_13c = -PStack_104.sizeTotal;
    uStack_140 = (int)uStack_13c >> 0x1f;
    uVar8 = 0;
    EVar9 = 0;
    pBStack_158 = pBVar5;
    pEStack_138 = (EVP_PKEY_CTX *)dst_;
    do {
      uVar16 = (ulong)uVar8;
      if ((RegGroup)uVar8 == kMask) break;
      RStack_159 = (RegGroup)uVar8;
      uStack_110 = (ulong)uVar8;
      pGVar11 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
                operator[]<asmjit::v1_14::RegGroup>(&PStack_104.groups,&RStack_159);
      uVar4 = pGVar11->pairCount;
      pRVar12 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&emitProlog::groupRegs,&RStack_159);
      OStack_130._signature._bits =
           (pRVar12->super_BaseReg).super_Operand.super_Operand_._signature._bits;
      OStack_130._baseId = (pRVar12->super_BaseReg).super_Operand.super_Operand_._baseId;
      OStack_130._data = *&(pRVar12->super_BaseReg).super_Operand.super_Operand_._data;
      pRVar12 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&emitProlog::groupRegs,&RStack_159);
      OStack_120._signature._bits =
           (pRVar12->super_BaseReg).super_Operand.super_Operand_._signature._bits;
      OStack_120._baseId = (pRVar12->super_BaseReg).super_Operand.super_Operand_._baseId;
      OStack_120._data = *&(pRVar12->super_BaseReg).super_Operand.super_Operand_._data;
      OStack_150._signature._bits = 0x3a;
      OStack_150._baseId = 0x1f;
      OStack_150._data[0] = 0;
      OStack_150._data[1] = 0;
      pLVar13 = Support::Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL>::
                operator[]<asmjit::v1_14::RegGroup>(&emitProlog::groupInsts,&RStack_159);
      uVar16 = 0;
      do {
        uVar14 = uVar16;
        if (uVar4 == uVar14) break;
        OStack_130._baseId._0_1_ = pGVar11->pairs[uVar14].ids[0];
        OStack_130._baseId._1_3_ = 0;
        OStack_120._baseId._0_1_ = pGVar11->pairs[uVar14].ids[1];
        OStack_120._baseId._1_3_ = 0;
        uVar3 = pGVar11->pairs[uVar14].offset;
        OStack_150._data[1]._0_2_ = uVar3;
        OStack_150._data[1]._2_2_ = 0;
        if (uVar3 == 0 && PStack_104.sizeTotal != 0) {
          OStack_150._data[1] = uStack_13c;
          uVar15 = uStack_140;
          if ((OStack_150._0_8_ & 0xf8) != 0) {
            uVar15 = OStack_150._baseId;
          }
          OStack_150._0_8_ =
               CONCAT44(uVar15,OStack_150._signature._bits) & 0xfffffffffcffffff | 0x1000000;
        }
        if (pGVar11->pairs[uVar14].ids[1] == 0xff) {
          EVar10 = BaseEmitter::_emitI(pBStack_158,pLVar13->singleInstId,&OStack_130,&OStack_150);
        }
        else {
          EVar10 = BaseEmitter::_emitI(pBStack_158,pLVar13->pairInstId,&OStack_130,&OStack_120,
                                       &OStack_150);
        }
        if (EVar10 == 0) {
          OStack_150._0_8_ = OStack_150._0_8_ & 0xfffffffffcffffff;
          bVar18 = true;
          if ((uVar14 == 0) && (((byte)*pEStack_138 & 0x10) != 0)) {
            EVar10 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::mov
                               ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBStack_158,
                                (Gp *)regs::x29,(Gp *)regs::sp);
            bVar18 = EVar10 == 0;
            if (!bVar18) {
              EVar9 = EVar10;
            }
          }
        }
        else {
          bVar18 = false;
          EVar9 = EVar10;
        }
        uVar16 = uVar14 + 1;
      } while (bVar18);
      uVar8 = (int)uStack_110 + 1;
      uVar16 = uStack_110;
    } while (uVar4 <= uVar14);
    pBVar5 = pBStack_158;
    if ((char)uVar16 != '\x02') {
      return EVar9;
    }
    uVar8 = *(uint *)(pEStack_138 + 0x2c);
    if (uVar8 == 0) {
      return 0;
    }
    if (uVar8 < 0x1000) {
LAB_00137734:
      OStack_130._data[1] = 0;
      OStack_130._data[0] = uVar8;
      OStack_130._signature._bits = 4;
      OStack_130._baseId = 0;
      EVar10 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::sub
                         ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBVar5,(Gp *)regs::sp,
                          (Gp *)regs::sp,(Imm *)&OStack_130);
      if (EVar10 == 0) {
        bVar18 = true;
        goto LAB_001377b1;
      }
    }
    else if (uVar8 < 0x1000000) {
      OStack_130._signature._bits = 4;
      OStack_130._baseId = 0;
      OStack_130._data[1] = 0;
      OStack_130._data[0] = uVar8 & 0xfff;
      EVar10 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::sub
                         ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBStack_158,
                          (Gp *)regs::sp,(Gp *)regs::sp,(Imm *)&OStack_130);
      if (EVar10 == 0) {
        uVar8 = uVar8 & 0xfff000;
        goto LAB_00137734;
      }
    }
    else {
      EVar10 = 3;
    }
    EVar9 = EVar10;
    bVar18 = false;
LAB_001377b1:
    if (bVar18) {
      return 0;
    }
    return EVar9;
  }
  if (((byte)(srcTypeId + ~_kVec512End) < 0xbb) || ((srcTypeId & 0x7e) == _kBaseStart))
  goto LAB_0013751c;
  uVar7 = (dst_->super_Operand).super_Operand_._baseId;
  local_48._data = *&(dst_->super_Operand).super_Operand_._data;
  local_38._signature._bits = (src_->_signature)._bits;
  local_38._baseId = src_->_baseId;
  local_38._data = *&src_->_data;
  uVar8 = (uint)srcTypeId;
  bVar1 = TypeUtils::_typeData[(ulong)srcTypeId + 0x100];
  local_48._baseId = uVar7;
  if (((byte)(srcTypeId - _kBaseStart) < 10) && ((byte)(bVar6 - 0x20) < 10)) {
    cVar2 = TypeUtils::_typeData[(uVar16 & 0xff) + 0x100];
    local_48._signature._bits = 0x4000031;
    if (cVar2 == '\b') {
      local_48._signature._bits = 0x8000039;
    }
    pBVar5 = (this->super_BaseEmitHelper)._emitter;
    pBVar5->_inlineComment = comment;
    if ((local_38._signature._bits & 7) == 2) {
      switch(uVar8) {
      case 0x22:
        IVar17 = 0x9f;
        break;
      case 0x23:
        IVar17 = 0x9d;
        break;
      case 0x24:
        IVar17 = 0xa0;
        break;
      case 0x25:
        IVar17 = 0x9e;
        break;
      case 0x26:
        IVar17 = 0x9a;
        if (cVar2 == '\b') {
          IVar17 = 0xa1;
        }
        break;
      case 0x27:
      case 0x28:
      case 0x29:
        IVar17 = 0x9a;
        break;
      default:
        uVar8 = 3;
        goto LAB_00137434;
      }
LAB_00137427:
      uVar8 = BaseEmitter::_emitI(pBVar5,IVar17,&local_48,&local_38);
LAB_00137434:
      bVar18 = false;
    }
    else {
      if ((local_38._signature._bits & 7) == 1) {
        local_38._signature._bits = local_48._signature._bits;
        IVar17 = 0xf4;
        goto LAB_00137427;
      }
      bVar18 = true;
    }
    if (!bVar18) {
      return uVar8;
    }
  }
  EVar9 = 3;
  if (((byte)(bVar6 - 0x2a) < 3 || (byte)(bVar6 - 0x33) < 0x32) &&
     ((byte)(srcTypeId - _kFloatStart) < 3 || (byte)(srcTypeId - _kVec32Start) < 0x32)) {
    uVar8 = bVar1 - 2;
    switch(uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) {
    case 0:
      local_48._signature._bits = 0x2000149;
      break;
    case 1:
      local_48._signature._bits = 0x4000151;
      break;
    default:
      goto switchD_00137496_caseD_2;
    case 3:
      local_48._signature._bits = 0x8000159;
      break;
    case 7:
      local_48._signature._bits = 0x10000161;
    }
    pBVar5 = (this->super_BaseEmitHelper)._emitter;
    pBVar5->_inlineComment = comment;
    if ((local_38._signature._bits & 7) == 2) {
      IVar17 = 0x224;
    }
    else {
      if ((local_38._signature._bits & 7) != 1) {
        return 3;
      }
      IVar17 = 0x228;
      if (bVar1 < 5) {
        IVar17 = 0x1ff;
      }
      local_38._signature._bits = local_48._signature._bits;
    }
    EVar9 = BaseEmitter::_emitI(pBVar5,IVar17,&local_48,&local_38);
  }
switchD_00137496_caseD_2:
  return EVar9;
}

Assistant:

Error EmitHelper::emitArgMove(
  const BaseReg& dst_, TypeId dstTypeId,
  const Operand_& src_, TypeId srcTypeId, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (dstTypeId == TypeId::kVoid) {
    const ArchTraits& archTraits = ArchTraits::byArch(_emitter->arch());
    dstTypeId = archTraits.regTypeToTypeId(dst_.type());
  }

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(dstTypeId) && !TypeUtils::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeUtils::isValid(srcTypeId) && !TypeUtils::isAbstract(srcTypeId));

  Reg dst(dst_.as<Reg>());
  Operand src(src_);

  uint32_t dstSize = TypeUtils::sizeOf(dstTypeId);
  uint32_t srcSize = TypeUtils::sizeOf(srcTypeId);

  if (TypeUtils::isInt(dstTypeId)) {
    if (TypeUtils::isInt(srcTypeId)) {
      uint32_t x = uint32_t(dstSize == 8);

      dst.setSignature(OperandSignature{x ? uint32_t(GpX::kSignature) : uint32_t(GpW::kSignature)});
      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        src.setSignature(dst.signature());
        return _emitter->emit(Inst::kIdMov, dst, src);
      }
      else if (src.isMem()) {
        InstId instId = Inst::kIdNone;
          switch (srcTypeId) {
          case TypeId::kInt8: instId = Inst::kIdLdrsb; break;
          case TypeId::kUInt8: instId = Inst::kIdLdrb; break;
          case TypeId::kInt16: instId = Inst::kIdLdrsh; break;
          case TypeId::kUInt16: instId = Inst::kIdLdrh; break;
          case TypeId::kInt32: instId = x ? Inst::kIdLdrsw : Inst::kIdLdr; break;
          case TypeId::kUInt32: instId = Inst::kIdLdr; break;
          case TypeId::kInt64: instId = Inst::kIdLdr; break;
          case TypeId::kUInt64: instId = Inst::kIdLdr; break;
          default:
            return DebugUtils::errored(kErrorInvalidState);
        }
        return _emitter->emit(instId, dst, src);
      }
    }
  }

  if (TypeUtils::isFloat(dstTypeId) || TypeUtils::isVec(dstTypeId)) {
    if (TypeUtils::isFloat(srcTypeId) || TypeUtils::isVec(srcTypeId)) {
      switch (srcSize) {
        case 2: dst.as<Vec>().setSignature(OperandSignature{VecH::kSignature}); break;
        case 4: dst.as<Vec>().setSignature(OperandSignature{VecS::kSignature}); break;
        case 8: dst.as<Vec>().setSignature(OperandSignature{VecD::kSignature}); break;
        case 16: dst.as<Vec>().setSignature(OperandSignature{VecV::kSignature}); break;
        default:
          return DebugUtils::errored(kErrorInvalidState);
      }

      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        InstId instId = srcSize <= 4 ? Inst::kIdFmov_v : Inst::kIdMov_v;
        src.setSignature(dst.signature());
        return _emitter->emit(instId, dst, src);
      }
      else if (src.isMem()) {
        return _emitter->emit(Inst::kIdLdr_v, dst, src);
      }
    }
  }

  return DebugUtils::errored(kErrorInvalidState);
}